

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall cfd::api::json::DecodePsbtInput::~DecodePsbtInput(DecodePsbtInput *this)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodePsbtInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtInput_00741c20;
  std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::~vector
            (&(this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
              super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->final_scriptwitness_).
             super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  DecodeUnlockingScript::~DecodeUnlockingScript(&this->final_scriptsig_);
  std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>::
  ~vector(&(this->bip32_derivs_).super_JsonVector<cfd::api::json::PsbtBip32Data>.
           super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
         );
  PsbtScriptData::~PsbtScriptData(&this->witness_script_);
  PsbtScriptData::~PsbtScriptData(&this->redeem_script_);
  pcVar1 = (this->sighash_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sighash_).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  ::~vector(&(this->partial_signatures_).super_JsonVector<cfd::api::json::PsbtSignatureData>.
             super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
           );
  (this->witness_utxo_).super_JsonClassBase<cfd::api::json::DecodePsbtUtxo>._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtUtxo_00741cb8;
  DecodePsbtLockingScript::~DecodePsbtLockingScript(&(this->witness_utxo_).script_pub_key_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->witness_utxo_).ignore_items._M_t);
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&this->non_witness_utxo_);
  pcVar1 = (this->non_witness_utxo_hex_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->non_witness_utxo_hex_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~DecodePsbtInput() {
    // do nothing
  }